

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O2

void prf_messages_del_handler
               (int type,int level,_func_void_int_int_char_ptr_void_ptr *func,void *data)

{
  prf_msg_handler_t **pppVar1;
  prf_msg_handler_t *__ptr;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = prf_array_count(prf_handlers[type]);
  uVar3 = 0;
  uVar4 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    pppVar1 = prf_handlers[type];
    __ptr = pppVar1[uVar3];
    if ((((__ptr != (prf_msg_handler_t *)0x0) && (__ptr->func == func)) && (__ptr->userdata == data)
        ) && (__ptr->level == level)) {
      free(__ptr);
      pppVar1[uVar3] = (prf_msg_handler_t *)0x0;
    }
  }
  return;
}

Assistant:

void
prf_messages_del_handler(
    int type,
    int level,
    void (*func)( int, int, const char *, void * ),
    void * data )
{
    int i, count;
    assert( type > 0 && type < 6 );
    count = prf_array_count( prf_handlers[type] );
    for ( i = 0; i < count; i++ ) {
        if ( (prf_handlers[type][i] != NULL) &&
             (prf_handlers[type][i]->func == func) &&
             (prf_handlers[type][i]->userdata == data) &&
             (prf_handlers[type][i]->level == level) ) {
            free( prf_handlers[type][i] );
            prf_handlers[type][i] = NULL;
        }
    }
    
}